

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>::Data
          (Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
           *this,Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                 *other)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  R_conflict9 RVar3;
  Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *newNode;
  Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *n;
  size_t index;
  Span *span;
  size_t s;
  R_conflict9 r;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff80;
  Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
  *this_00;
  ulong local_58;
  ulong local_48;
  size_t in_stack_ffffffffffffffc0;
  Span *local_28;
  size_t local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff80,(int)((ulong)in_RDI >> 0x20));
  *(undefined8 *)
   &(((function<bool_(const_void_*,_void_*)> *)((pair<int,_int> *)in_RDI->offsets + 1))->
    super__Function_base)._M_functor = *(undefined8 *)(in_RSI + 8);
  ((pair<int,_int> *)in_RDI->offsets)[2] = (pair<int,_int>)*(undefined8 *)(in_RSI + 0x10);
  ((pair<int,_int> *)in_RDI->offsets)[3] = (pair<int,_int>)*(_Manager_type *)(in_RSI + 0x18);
  ((pair<int,_int> *)in_RDI->offsets)[4] = (pair<int,_int>)0x0;
  RVar3 = allocateSpans(in_stack_ffffffffffffffc0);
  local_28 = RVar3.spans;
  ((pair<int,_int> *)in_RDI->offsets)[4] = (pair<int,_int>)local_28;
  local_20 = RVar3.nSpans;
  this_00 = in_RDI;
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
      bVar2 = Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
              ::hasNode((Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                         *)(lVar1 + local_48 * 0x90),local_58);
      if (bVar2) {
        Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
        ::at(this_00,(size_t)in_RDI);
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        Bucket::Bucket(&local_18,(Span *)(*(long *)(this_00->offsets + 0x20) + local_48 * 0x90),
                       local_58);
        Bucket::insert((Bucket *)0x3d8a0b);
        Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::Node
                  ((Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)this_00
                   ,(Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)in_RDI
                  );
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }